

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_double_as_string(void)

{
  bool bVar1;
  __type v;
  error_code eVar2;
  int local_2d8 [2];
  error_category *local_2d0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_2c0;
  type local_2a0;
  undefined8 local_280;
  type_conflict9 local_278 [2];
  undefined1 local_268 [8];
  error_code error_3;
  variable data_3;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_210;
  type local_1f0;
  undefined8 local_1d0;
  type_conflict9 local_1c8 [2];
  undefined1 local_1b8 [8];
  error_code error_2;
  variable data_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_160;
  type local_140;
  undefined8 local_120;
  type_conflict9 local_118 [2];
  undefined1 local_108 [8];
  error_code error_1;
  variable data_1;
  string local_b0 [32];
  type local_90;
  undefined8 local_60;
  type_conflict9 local_58 [2];
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,0.0);
  std::error_code::error_code((error_code *)local_48);
  local_58[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_60 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1693,"void value_suite::fail_double_as_string()",local_58,&local_60);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1694,"void value_suite::fail_double_as_string()",!bVar1);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_90,(basic_variable<std::allocator<char>> *)&error._M_cat,(error_code *)local_48)
  ;
  std::__cxx11::string::string(local_b0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,std::__cxx11::string>
            ("data.value<std::string>(error)","std::string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1695,"void value_suite::fail_double_as_string()",&local_90,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  data_1.storage._40_4_ = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1696,"void value_suite::fail_double_as_string()",local_48,&data_1.storage.field_0x28
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,0.0);
  std::error_code::error_code((error_code *)local_108);
  local_118[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                           ((basic_variable<std::allocator<char>_> *)&error_1._M_cat,
                            (error_code *)local_108);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x169b,"void value_suite::fail_double_as_string()",local_118,&local_120);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_108);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x169c,"void value_suite::fail_double_as_string()",!bVar1);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_140,(basic_variable<std::allocator<char>> *)&error_1._M_cat,
             (error_code *)local_108);
  std::__cxx11::wstring::wstring((wstring *)&local_160);
  v = std::operator==(&local_140,&local_160);
  boost::detail::test_impl
            ("data.value<std::wstring>(error) == std::wstring{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x169d,"void value_suite::fail_double_as_string()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_160);
  std::__cxx11::wstring::~wstring((wstring *)&local_140);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  data_2.storage._40_4_ = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x169e,"void value_suite::fail_double_as_string()",local_108,
             &data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat,0.0);
  std::error_code::error_code((error_code *)local_1b8);
  local_1c8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                           ((basic_variable<std::allocator<char>_> *)&error_2._M_cat,
                            (error_code *)local_1b8);
  local_1d0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16a3,"void value_suite::fail_double_as_string()",local_1c8,&local_1d0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_1b8);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16a4,"void value_suite::fail_double_as_string()",!bVar1);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_1f0,(basic_variable<std::allocator<char>> *)&error_2._M_cat,
             (error_code *)local_1b8);
  std::__cxx11::u16string::u16string((u16string *)&local_210);
  bVar1 = std::operator==(&local_1f0,&local_210);
  boost::detail::test_impl
            ("data.value<std::u16string>(error) == std::u16string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16a5,"void value_suite::fail_double_as_string()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&local_210);
  std::__cxx11::u16string::~u16string((u16string *)&local_1f0);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  data_3.storage._40_4_ = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16a6,"void value_suite::fail_double_as_string()",local_1b8,
             &data_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat,0.0);
  std::error_code::error_code((error_code *)local_268);
  local_278[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                           ((basic_variable<std::allocator<char>_> *)&error_3._M_cat,
                            (error_code *)local_268);
  local_280 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16ab,"void value_suite::fail_double_as_string()",local_278,&local_280);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_268);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16ac,"void value_suite::fail_double_as_string()",!bVar1);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_2a0,(basic_variable<std::allocator<char>> *)&error_3._M_cat,
             (error_code *)local_268);
  std::__cxx11::u32string::u32string((u32string *)&local_2c0);
  bVar1 = std::operator==(&local_2a0,&local_2c0);
  boost::detail::test_impl
            ("data.value<std::u32string>(error) == std::u32string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16ad,"void value_suite::fail_double_as_string()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&local_2c0);
  std::__cxx11::u32string::~u32string((u32string *)&local_2a0);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_2d0 = eVar2._M_cat;
  local_2d8[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16ae,"void value_suite::fail_double_as_string()",local_268,local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat);
  return;
}

Assistant:

void fail_double_as_string()
{
    {
        variable data(0.0);
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(error), 0.0);
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<std::string>(error), std::string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(0.0);
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(error), 0.0);
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>(error) == std::wstring{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(0.0);
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(error), 0.0);
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>(error) == std::u16string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data(0.0);
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(error), 0.0);
        TRIAL_PROTOCOL_TEST(!error);
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>(error) == std::u32string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}